

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O0

Matrix * __thiscall
QPDFObjectHandle::getArrayAsMatrix(Matrix *__return_storage_ptr__,QPDFObjectHandle *this)

{
  bool bVar1;
  int iVar2;
  pair<bool,_QPDFObjectHandle> local_98;
  undefined1 local_80 [8];
  QPDFObjectHandle item;
  double dStack_68;
  int i;
  double items [6];
  undefined1 local_28 [8];
  Array array;
  QPDFObjectHandle *this_local;
  
  array.sp_elements._M_t.
  super___uniq_ptr_impl<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>_>
  .super__Head_base<0UL,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>,_std::default_delete<std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>,_true,_true>
                    )this;
  as_array((Array *)local_28,this,strict);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_28);
  if (bVar1) {
    iVar2 = ::qpdf::Array::size((Array *)local_28);
    if (iVar2 == 6) {
      for (item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_4_ = 0;
          item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ < 6;
          item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ =
               item.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ + 1) {
        ::qpdf::Array::at(&local_98,(Array *)local_28,
                          item.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                          _M_pi._4_4_);
        QPDFObjectHandle((QPDFObjectHandle *)local_80,&local_98.second);
        std::pair<bool,_QPDFObjectHandle>::~pair(&local_98);
        bVar1 = getValueAsNumber((QPDFObjectHandle *)local_80,
                                 items + (long)item.super_BaseHandle.obj.
                                               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount._M_pi._4_4_ + -1);
        if (!bVar1) {
          Matrix::Matrix(__return_storage_ptr__);
        }
        items[5]._1_3_ = 0;
        items[5]._0_1_ = !bVar1;
        ~QPDFObjectHandle((QPDFObjectHandle *)local_80);
        if (items[5]._0_4_ != 0) goto LAB_0032bd95;
      }
      Matrix::Matrix(__return_storage_ptr__,dStack_68,items[0],items[1],items[2],items[3],items[4]);
      items[5]._0_4_ = 1;
    }
    else {
      Matrix::Matrix(__return_storage_ptr__);
      items[5]._0_4_ = 1;
    }
  }
  else {
    items[5]._0_4_ = 0;
  }
LAB_0032bd95:
  ::qpdf::Array::~Array((Array *)local_28);
  if (items[5]._0_4_ == 0) {
    Matrix::Matrix(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFObjectHandle::Matrix
QPDFObjectHandle::getArrayAsMatrix() const
{
    if (auto array = as_array(strict)) {
        if (array.size() != 6) {
            return {};
        }
        double items[6];
        for (int i = 0; i < 6; ++i) {
            if (auto item = array.at(i).second; !item.getValueAsNumber(items[i])) {
                return {};
            }
        }
        return {items[0], items[1], items[2], items[3], items[4], items[5]};
    }
    return {};
}